

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascDecrypt.cpp
# Opt level: O2

int CascDecrypt(TCascStorage *hs,LPBYTE pbOutBuffer,PDWORD pcbOutBuffer,LPBYTE pbInBuffer,
               DWORD cbInBuffer,DWORD dwFrameIndex)

{
  byte bVar1;
  BYTE BVar2;
  uint *puVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  LPBYTE pBVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  byte *__dest;
  LPBYTE pBVar13;
  uint local_178 [16];
  ulong local_138;
  ulong local_128;
  uint *local_110;
  ULONGLONG KeyName;
  int local_f4 [6];
  BYTE aBStack_dc [8];
  uint local_d4;
  uint uStack_d0;
  undefined4 uStack_cc;
  uint uStack_c8;
  uint local_c4;
  uint uStack_c0;
  uint uStack_bc;
  undefined4 uStack_b8;
  BYTE Vector [8];
  byte abStack_78 [72];
  
  KeyName = 0;
  iVar12 = 0x3ec;
  if (cbInBuffer != 0) {
    uVar11 = (ulong)*pbInBuffer;
    if ((*pbInBuffer & 0xf7) == 0) {
      pBVar13 = pbInBuffer + cbInBuffer;
      pBVar9 = pbInBuffer + uVar11 + 1;
      if (pBVar9 < pBVar13) {
        local_110 = pcbOutBuffer;
        memcpy(&KeyName,pbInBuffer + 1,uVar11);
        bVar1 = (pbInBuffer + 1)[uVar11];
        uVar11 = (ulong)bVar1;
        if ((bVar1 == 8) || (bVar1 == 4)) {
          if (pBVar9 + uVar11 + 1 < pBVar13) {
            __dest = Vector;
            Vector[0] = '\0';
            Vector[1] = '\0';
            Vector[2] = '\0';
            Vector[3] = '\0';
            Vector[4] = '\0';
            Vector[5] = '\0';
            Vector[6] = '\0';
            Vector[7] = '\0';
            memcpy(__dest,pBVar9 + 1,uVar11);
            BVar2 = (pBVar9 + 1)[uVar11];
            if ((BVar2 == 'S') || (iVar12 = 0x5f, BVar2 == 'A')) {
              pBVar9 = pBVar9 + uVar11 + 2;
              local_138 = (long)pBVar13 - (long)pBVar9;
              if (*local_110 < (uint)local_138) {
                iVar12 = 0x69;
              }
              else {
                puVar3 = (uint *)CascFindKey(hs,KeyName);
                if (puVar3 == (uint *)0x0) {
                  iVar12 = 0x3ed;
                }
                else {
                  for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 8) {
                    *__dest = *__dest ^ (byte)(dwFrameIndex >> ((byte)lVar7 & 0x1f));
                    __dest = __dest + 1;
                  }
                  if (BVar2 != 'S') {
                    __assert_fail("false",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascDecrypt.cpp"
                                  ,0x1a9,
                                  "int CascDecrypt(TCascStorage *, LPBYTE, PDWORD, LPBYTE, DWORD, DWORD)"
                                 );
                  }
                  local_f4[0] = 0x61707865;
                  local_f4[1] = *puVar3;
                  local_f4[2] = puVar3[1];
                  local_f4[3] = puVar3[2];
                  local_f4[4] = puVar3[3];
                  local_f4[5] = 0x3120646e;
                  aBStack_dc[0] = Vector[0];
                  aBStack_dc[1] = Vector[1];
                  aBStack_dc[2] = Vector[2];
                  aBStack_dc[3] = Vector[3];
                  aBStack_dc[4] = Vector[4];
                  aBStack_dc[5] = Vector[5];
                  aBStack_dc[6] = Vector[6];
                  aBStack_dc[7] = Vector[7];
                  local_d4 = 0;
                  uStack_d0 = 0;
                  uStack_cc = 0x79622d36;
                  uStack_c8 = local_f4[1];
                  local_c4 = local_f4[2];
                  uStack_c0 = local_f4[3];
                  uStack_bc = local_f4[4];
                  uStack_b8 = 0x6b206574;
                  uVar6 = 0;
                  for (uVar11 = local_138; uVar11 != 0; uVar11 = uVar11 - uVar4) {
                    local_178[0] = 0x61707865;
                    local_178[5] = 0x3120646e;
                    local_178[10] = 0x79622d36;
                    local_128 = (ulong)Vector & 0xffffffff;
                    local_178[0xf] = 0x6b206574;
                    local_178[7] = Vector._4_4_;
                    local_178[4] = local_f4[4];
                    local_178[0xc] = local_f4[2];
                    local_178[0xd] = local_f4[3];
                    local_178[0xe] = local_f4[4];
                    local_178[0xb] = local_f4[1];
                    local_178[8] = local_d4;
                    local_178[9] = uStack_d0;
                    local_178[3] = local_f4[3];
                    local_178[1] = local_f4[1];
                    local_178[2] = local_f4[2];
                    for (uVar5 = 0; local_178[6] = (uint)local_128, uVar5 < 0x14; uVar5 = uVar5 + 2)
                    {
                      local_178[4] = ((local_178[0] + local_178[0xc]) * 0x80 |
                                     local_178[0] + local_178[0xc] >> 0x19) ^ local_178[4];
                      local_178[8] = ((local_178[4] + local_178[0]) * 0x200 |
                                     local_178[4] + local_178[0] >> 0x17) ^ local_178[8];
                      local_178[0xc] =
                           ((local_178[8] + local_178[4]) * 0x2000 |
                           local_178[8] + local_178[4] >> 0x13) ^ local_178[0xc];
                      uVar10 = local_178[8] + local_178[0xc];
                      local_178[0] = (uVar10 * 0x40000 | uVar10 >> 0xe) ^ local_178[0];
                      local_178[9] = ((local_178[5] + local_178[1]) * 0x80 |
                                     local_178[5] + local_178[1] >> 0x19) ^ local_178[9];
                      local_178[0xd] =
                           ((local_178[9] + local_178[5]) * 0x200 |
                           local_178[9] + local_178[5] >> 0x17) ^ local_178[0xd];
                      local_178[1] = ((local_178[0xd] + local_178[9]) * 0x2000 |
                                     local_178[0xd] + local_178[9] >> 0x13) ^ local_178[1];
                      uVar10 = local_178[1] + local_178[0xd];
                      local_178[5] = (uVar10 * 0x40000 | uVar10 >> 0xe) ^ local_178[5];
                      local_178[0xe] =
                           ((local_178[6] + local_178[10]) * 0x80 |
                           local_178[6] + local_178[10] >> 0x19) ^ local_178[0xe];
                      local_178[2] = ((local_178[0xe] + local_178[10]) * 0x200 |
                                     local_178[0xe] + local_178[10] >> 0x17) ^ local_178[2];
                      local_178[6] = ((local_178[2] + local_178[0xe]) * 0x2000 |
                                     local_178[2] + local_178[0xe] >> 0x13) ^ local_178[6];
                      uVar10 = local_178[6] + local_178[2];
                      local_178[10] = (uVar10 * 0x40000 | uVar10 >> 0xe) ^ local_178[10];
                      local_178[3] = ((local_178[0xf] + local_178[0xb]) * 0x80 |
                                     local_178[0xf] + local_178[0xb] >> 0x19) ^ local_178[3];
                      local_178[7] = ((local_178[3] + local_178[0xf]) * 0x200 |
                                     local_178[3] + local_178[0xf] >> 0x17) ^ local_178[7];
                      local_178[0xb] =
                           ((local_178[3] + local_178[7]) * 0x2000 |
                           local_178[3] + local_178[7] >> 0x13) ^ local_178[0xb];
                      uVar10 = local_178[0xb] + local_178[7];
                      local_178[0xf] = (uVar10 * 0x40000 | uVar10 >> 0xe) ^ local_178[0xf];
                      local_178[1] = ((local_178[0] + local_178[3]) * 0x80 |
                                     local_178[0] + local_178[3] >> 0x19) ^ local_178[1];
                      local_178[2] = ((local_178[1] + local_178[0]) * 0x200 |
                                     local_178[1] + local_178[0] >> 0x17) ^ local_178[2];
                      local_178[3] = ((local_178[2] + local_178[1]) * 0x2000 |
                                     local_178[2] + local_178[1] >> 0x13) ^ local_178[3];
                      local_178[0] = ((local_178[3] + local_178[2]) * 0x40000 |
                                     local_178[3] + local_178[2] >> 0xe) ^ local_178[0];
                      local_178[6] = ((local_178[5] + local_178[4]) * 0x80 |
                                     local_178[5] + local_178[4] >> 0x19) ^ local_178[6];
                      local_128 = (ulong)local_178[6];
                      local_178[7] = ((local_178[6] + local_178[5]) * 0x200 |
                                     local_178[6] + local_178[5] >> 0x17) ^ local_178[7];
                      local_178[4] = ((local_178[7] + local_178[6]) * 0x2000 |
                                     local_178[7] + local_178[6] >> 0x13) ^ local_178[4];
                      local_178[5] = ((local_178[7] + local_178[4]) * 0x40000 |
                                     local_178[7] + local_178[4] >> 0xe) ^ local_178[5];
                      local_178[0xb] =
                           ((local_178[10] + local_178[9]) * 0x80 |
                           local_178[10] + local_178[9] >> 0x19) ^ local_178[0xb];
                      local_178[8] = ((local_178[0xb] + local_178[10]) * 0x200 |
                                     local_178[0xb] + local_178[10] >> 0x17) ^ local_178[8];
                      local_178[9] = ((local_178[0xb] + local_178[8]) * 0x2000 |
                                     local_178[0xb] + local_178[8] >> 0x13) ^ local_178[9];
                      local_178[10] =
                           ((local_178[9] + local_178[8]) * 0x40000 |
                           local_178[9] + local_178[8] >> 0xe) ^ local_178[10];
                      local_178[0xc] =
                           ((local_178[0xf] + local_178[0xe]) * 0x80 |
                           local_178[0xf] + local_178[0xe] >> 0x19) ^ local_178[0xc];
                      local_178[0xd] =
                           ((local_178[0xc] + local_178[0xf]) * 0x200 |
                           local_178[0xc] + local_178[0xf] >> 0x17) ^ local_178[0xd];
                      local_178[0xe] =
                           ((local_178[0xd] + local_178[0xc]) * 0x2000 |
                           local_178[0xd] + local_178[0xc] >> 0x13) ^ local_178[0xe];
                      local_178[0xf] =
                           ((local_178[0xe] + local_178[0xd]) * 0x40000 |
                           local_178[0xe] + local_178[0xd] >> 0xe) ^ local_178[0xf];
                    }
                    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
                      *(uint *)(abStack_78 + lVar7 * 4) = local_f4[lVar7] + local_178[lVar7];
                    }
                    uVar4 = 0x40;
                    if (uVar11 < 0x40) {
                      uVar4 = uVar11;
                    }
                    for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
                      pbOutBuffer[uVar8] = abStack_78[uVar8] ^ pBVar9[uVar8];
                    }
                    local_d4 = local_d4 + 1;
                    if (local_d4 == 0) {
                      uVar6 = uVar6 + 1;
                      uStack_d0 = uVar6;
                    }
                    pbOutBuffer = pbOutBuffer + uVar4;
                    pBVar9 = pBVar9 + uVar4;
                  }
                  *local_110 = (uint)local_138;
                  iVar12 = 0;
                }
              }
            }
          }
        }
        else {
          iVar12 = 0x5f;
        }
      }
    }
    else {
      iVar12 = 0x5f;
    }
  }
  return iVar12;
}

Assistant:

int CascDecrypt(TCascStorage * hs, LPBYTE pbOutBuffer, PDWORD pcbOutBuffer, LPBYTE pbInBuffer, DWORD cbInBuffer, DWORD dwFrameIndex)
{
    ULONGLONG KeyName = 0;
    LPBYTE pbBufferEnd = pbInBuffer + cbInBuffer;
    LPBYTE pbKey;
    DWORD KeyNameSize;
    DWORD dwShift = 0;
    DWORD IVSize;
    BYTE Vector[0x08];
    BYTE EncryptionType;
    int nError;

    // Verify and retrieve the key name size
    if(pbInBuffer >= pbBufferEnd)
        return ERROR_FILE_CORRUPT;
    if(pbInBuffer[0] != 0 && pbInBuffer[0] != 8)
        return ERROR_NOT_SUPPORTED;
    KeyNameSize = *pbInBuffer++;

    // Copy the key name
    if((pbInBuffer + KeyNameSize) >= pbBufferEnd)
        return ERROR_FILE_CORRUPT;
    memcpy(&KeyName, pbInBuffer, KeyNameSize);
    pbInBuffer += KeyNameSize;

    // Verify and retrieve the Vector size
    if(pbInBuffer >= pbBufferEnd)
        return ERROR_FILE_CORRUPT;
    if(pbInBuffer[0] != 4 && pbInBuffer[0] != 8)
        return ERROR_NOT_SUPPORTED;
    IVSize = *pbInBuffer++;

    // Copy the initialization vector
    if((pbInBuffer + IVSize) >= pbBufferEnd)
        return ERROR_FILE_CORRUPT;
    memset(Vector, 0, sizeof(Vector));
    memcpy(Vector, pbInBuffer, IVSize);
    pbInBuffer += IVSize;

    // Verify and retrieve the encryption type
    if(pbInBuffer >= pbBufferEnd)
        return ERROR_FILE_CORRUPT;
    if(pbInBuffer[0] != 'S' && pbInBuffer[0] != 'A')
        return ERROR_NOT_SUPPORTED;
    EncryptionType = *pbInBuffer++;

    // Do we have enough space in the output buffer?
    if((DWORD)(pbBufferEnd - pbInBuffer) > pcbOutBuffer[0])
        return ERROR_INSUFFICIENT_BUFFER;

    // Check if we know the key
    pbKey = CascFindKey(hs, KeyName);
    if(pbKey == NULL)
        return ERROR_FILE_ENCRYPTED;

    // Shuffle the Vector with the block index
    // Note that there's no point to go beyond 32 bits, unless the file has
    // more than 0xFFFFFFFF frames.
    for(size_t i = 0; i < sizeof(dwFrameIndex); i++)
    {
        Vector[i] = Vector[i] ^ (BYTE)((dwFrameIndex >> dwShift) & 0xFF);
        dwShift += 8;
    }

    // Perform the decryption-specific action
    switch(EncryptionType)
    {
        case 'S':   // Salsa20
            nError = Decrypt_Salsa20(pbOutBuffer, pbInBuffer, (pbBufferEnd - pbInBuffer), pbKey, 0x10, Vector);
            if(nError != ERROR_SUCCESS)
                return nError;

            // Supply the size of the output buffer
            pcbOutBuffer[0] = (DWORD)(pbBufferEnd - pbInBuffer);
            return ERROR_SUCCESS;

//      case 'A':   
//          return ERROR_NOT_SUPPORTED;
    }

    assert(false);
    return ERROR_NOT_SUPPORTED;
}